

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockBuilderCopyWindowSettings(char *src_name,char *dst_name)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindowSettings *pIVar3;
  int iVar4;
  uint uVar5;
  
  pIVar1 = FindWindowByName(src_name);
  if (pIVar1 != (ImGuiWindow *)0x0) {
    pIVar2 = FindWindowByName(dst_name);
    if (pIVar2 == (ImGuiWindow *)0x0) {
      pIVar3 = FindOrCreateWindowSettings(dst_name);
      if (pIVar3 != (ImGuiWindowSettings *)0x0) {
        uVar5 = (uint)(pIVar1->Pos).x;
        iVar4 = (int)(pIVar1->Pos).y;
        if ((pIVar1->ViewportId == 0) || (pIVar1->ViewportId == 0x11111111)) {
          pIVar3->Pos = (ImVec2ih)(uVar5 & 0xffff | iVar4 << 0x10);
        }
        else {
          pIVar3->ViewportPos = (ImVec2ih)(uVar5 & 0xffff | iVar4 << 0x10);
          pIVar3->ViewportId = pIVar1->ViewportId;
          (pIVar3->Pos).x = 0;
          (pIVar3->Pos).y = 0;
        }
        pIVar3->Size = (ImVec2ih)
                       ((int)(pIVar1->SizeFull).x & 0xffffU | (int)(pIVar1->SizeFull).y << 0x10);
        pIVar3->Collapsed = pIVar1->Collapsed;
      }
    }
    else {
      pIVar2->Pos = pIVar1->Pos;
      pIVar2->Size = pIVar1->Size;
      pIVar2->SizeFull = pIVar1->SizeFull;
      pIVar2->Collapsed = pIVar1->Collapsed;
    }
  }
  return;
}

Assistant:

void ImGui::DockBuilderCopyWindowSettings(const char* src_name, const char* dst_name)
{
    ImGuiWindow* src_window = FindWindowByName(src_name);
    if (src_window == NULL)
        return;
    if (ImGuiWindow* dst_window = FindWindowByName(dst_name))
    {
        dst_window->Pos = src_window->Pos;
        dst_window->Size = src_window->Size;
        dst_window->SizeFull = src_window->SizeFull;
        dst_window->Collapsed = src_window->Collapsed;
    }
    else if (ImGuiWindowSettings* dst_settings = FindOrCreateWindowSettings(dst_name))
    {
        ImVec2ih window_pos_2ih = ImVec2ih(src_window->Pos);
        if (src_window->ViewportId != 0 && src_window->ViewportId != IMGUI_VIEWPORT_DEFAULT_ID)
        {
            dst_settings->ViewportPos = window_pos_2ih;
            dst_settings->ViewportId = src_window->ViewportId;
            dst_settings->Pos = ImVec2ih(0, 0);
        }
        else
        {
            dst_settings->Pos = window_pos_2ih;
        }
        dst_settings->Size = ImVec2ih(src_window->SizeFull);
        dst_settings->Collapsed = src_window->Collapsed;
    }
}